

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_mechanism.c
# Opt level: O3

int saslmechanism_get_init_bytes
              (SASL_MECHANISM_HANDLE sasl_mechanism,SASL_MECHANISM_BYTES *init_bytes)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (sasl_mechanism == (SASL_MECHANISM_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x5c;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x5c;
    }
    pcVar4 = "NULL sasl_mechanism";
    iVar3 = 0x5b;
  }
  else {
    iVar1 = (*sasl_mechanism->sasl_mechanism_interface_description->
              concrete_sasl_mechanism_get_init_bytes)
                      (sasl_mechanism->concrete_sasl_mechanism_handle,init_bytes);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x65;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x65;
    }
    pcVar4 = "concrete_sasl_mechanism_get_init_bytes failed";
    iVar3 = 100;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/sasl_mechanism.c"
            ,"saslmechanism_get_init_bytes",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

int saslmechanism_get_init_bytes(SASL_MECHANISM_HANDLE sasl_mechanism, SASL_MECHANISM_BYTES* init_bytes)
{
    int result;

    /* Codes_SRS_SASL_MECHANISM_01_012: [If the argument `sasl_mechanism` is NULL, `saslmechanism_get_init_bytes` shall fail and return a non-zero value.] */
    if (sasl_mechanism == NULL)
    {
        LogError("NULL sasl_mechanism");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_SASL_MECHANISM_01_010: [`saslmechanism_get_init_bytes` shall call the specific `concrete_sasl_mechanism_get_init_bytes` function specified in `saslmechanism_create`, passing the `init_bytes` argument to it.] */
        if (sasl_mechanism->sasl_mechanism_interface_description->concrete_sasl_mechanism_get_init_bytes(sasl_mechanism->concrete_sasl_mechanism_handle, init_bytes) != 0)
        {
            /* Codes_SRS_SASL_MECHANISM_01_013: [If the underlying `concrete_sasl_mechanism_get_init_bytes` fails, `saslmechanism_get_init_bytes` shall fail and return a non-zero value.] */
            LogError("concrete_sasl_mechanism_get_init_bytes failed");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_SASL_MECHANISM_01_011: [On success, `saslmechanism_get_init_bytes` shall return 0.] */
            result = 0;
        }
    }

    return result;
}